

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch_tests.cpp
# Opt level: O0

void __thiscall minisketch_tests::minisketch_test::test_method(minisketch_test *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long in_FS_OFFSET;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t b;
  uint32_t a;
  uint32_t end_b;
  uint32_t start_b;
  uint32_t end_a;
  uint32_t both;
  uint32_t b_not_a;
  uint32_t a_not_b;
  uint32_t start_a;
  uint32_t errors;
  int i;
  type sols;
  Minisketch sketch_c;
  Minisketch sketch_br;
  Minisketch sketch_ar;
  Minisketch sketch_b;
  Minisketch sketch_a;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> dec;
  char *in_stack_fffffffffffffd48;
  lazy_ostream *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd6c;
  lazy_ostream *in_stack_fffffffffffffd70;
  Minisketch *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  lazy_ostream *in_stack_fffffffffffffd88;
  Minisketch *in_stack_fffffffffffffd98;
  lazy_ostream *in_stack_fffffffffffffda8;
  Minisketch *in_stack_fffffffffffffdb0;
  uint local_21c;
  uint local_214;
  uint local_200;
  uint local_1f0;
  int local_1cc;
  lazy_ostream local_1bc;
  lazy_ostream local_164;
  undefined1 local_150 [48];
  Minisketch local_110 [3];
  const_string local_f8 [2];
  lazy_ostream local_d8 [2];
  assertion_result local_b8 [7];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_1cc = 0; local_1cc < 100; local_1cc = local_1cc + 1) {
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd70,
                       in_stack_fffffffffffffd6c);
    iVar3 = RandomMixin<FastRandomContext>::randrange<int>
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd70,
                       in_stack_fffffffffffffd6c);
    uVar4 = iVar3 + 1;
    uVar5 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd70,
                       in_stack_fffffffffffffd6c);
    iVar3 = RandomMixin<FastRandomContext>::randrange<int>
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd70,
                       in_stack_fffffffffffffd6c);
    uVar6 = uVar4 + uVar5;
    ::node::MakeMinisketch32((size_t)in_stack_fffffffffffffd50);
    for (local_1f0 = uVar4; local_1f0 < uVar4 + uVar5 + iVar3; local_1f0 = local_1f0 + 1) {
      Minisketch::Add((Minisketch *)in_stack_fffffffffffffd58,(uint64_t)in_stack_fffffffffffffd50);
    }
    ::node::MakeMinisketch32((size_t)in_stack_fffffffffffffd50);
    for (local_200 = uVar6; local_200 < uVar6 + iVar3 + (iVar2 - uVar5); local_200 = local_200 + 1)
    {
      Minisketch::Add((Minisketch *)in_stack_fffffffffffffd58,(uint64_t)in_stack_fffffffffffffd50);
    }
    ::node::MakeMinisketch32((size_t)in_stack_fffffffffffffd50);
    ::node::MakeMinisketch32((size_t)in_stack_fffffffffffffd50);
    Minisketch::Serialize(in_stack_fffffffffffffd98);
    Minisketch::Deserialize<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ((Minisketch *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffd60._M_current,in_stack_fffffffffffffd58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd58);
    Minisketch::Serialize(in_stack_fffffffffffffd98);
    Minisketch::Deserialize<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ((Minisketch *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffd60._M_current,in_stack_fffffffffffffd58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd58);
    Minisketch::Minisketch((Minisketch *)in_stack_fffffffffffffd48,(Minisketch *)0x80a1c9);
    Minisketch::Merge((Minisketch *)in_stack_fffffffffffffd58,
                      (Minisketch *)in_stack_fffffffffffffd50);
    Minisketch::Decode(in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8);
    do {
      in_stack_fffffffffffffdb0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd58,
                 (pointer)in_stack_fffffffffffffd50,(unsigned_long)in_stack_fffffffffffffd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffd88,
                 (const_string *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                 (size_t)in_stack_fffffffffffffd78,(const_string *)in_stack_fffffffffffffd70);
      std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::has_value
                ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                 in_stack_fffffffffffffd48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffd58,
                 SUB81((ulong)in_stack_fffffffffffffd50 >> 0x38,0));
      in_stack_fffffffffffffda8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd58,
                 (pointer)in_stack_fffffffffffffd50,(unsigned_long)in_stack_fffffffffffffd48);
      boost::unit_test::operator<<
                (in_stack_fffffffffffffd50,(basic_cstring<const_char> *)in_stack_fffffffffffffd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd58,
                 (pointer)in_stack_fffffffffffffd50,(unsigned_long)in_stack_fffffffffffffd48);
      in_stack_fffffffffffffd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_b8,local_d8,local_f8,0x2c,REQUIRE,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator*
              ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               in_stack_fffffffffffffd48);
    in_stack_fffffffffffffd98 = local_110;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd48,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x80a360);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd50);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd50);
    __first._M_current._4_4_ = in_stack_fffffffffffffd6c;
    __first._M_current._0_4_ = in_stack_fffffffffffffd68;
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (__first,in_stack_fffffffffffffd60);
    for (local_214 = 0; local_214 < uVar5; local_214 = local_214 + 1) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd58,
                   (pointer)in_stack_fffffffffffffd50,(unsigned_long)in_stack_fffffffffffffd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd48);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffd88,
                   (const_string *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                   (size_t)in_stack_fffffffffffffd78,(const_string *)in_stack_fffffffffffffd70);
        in_stack_fffffffffffffd88 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_fffffffffffffd50,(char (*) [1])in_stack_fffffffffffffd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd58,
                   (pointer)in_stack_fffffffffffffd50,(unsigned_long)in_stack_fffffffffffffd48);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffd58,(size_type)in_stack_fffffffffffffd50);
        local_164._vptr_lazy_ostream._0_4_ = uVar4 + local_214;
        in_stack_fffffffffffffd58 = "start_a + i";
        in_stack_fffffffffffffd50 = &local_164;
        in_stack_fffffffffffffd48 = "sols[i]";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                  (local_150,(undefined1 *)((long)&local_164._vptr_lazy_ostream + 4),0x2f,1,2);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffffd48);
        in_stack_fffffffffffffd87 = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffffd87);
    }
    for (local_21c = 0; local_21c < iVar2 - uVar5; local_21c = local_21c + 1) {
      do {
        in_stack_fffffffffffffd78 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd58,
                   (pointer)in_stack_fffffffffffffd50,(unsigned_long)in_stack_fffffffffffffd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd48);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffd88,
                   (const_string *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                   (size_t)in_stack_fffffffffffffd78,(const_string *)in_stack_fffffffffffffd70);
        in_stack_fffffffffffffd70 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_fffffffffffffd50,(char (*) [1])in_stack_fffffffffffffd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd58,
                   (pointer)in_stack_fffffffffffffd50,(unsigned_long)in_stack_fffffffffffffd48);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffd58,(size_type)in_stack_fffffffffffffd50);
        local_1bc._vptr_lazy_ostream._0_4_ = uVar6 + iVar3 + local_21c;
        in_stack_fffffffffffffd58 = "start_b + both + i";
        in_stack_fffffffffffffd50 = &local_1bc;
        in_stack_fffffffffffffd48 = "sols[i + a_not_b]";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                  (&stack0xfffffffffffffe58,(undefined1 *)((long)&local_1bc._vptr_lazy_ostream + 4),
                   0x30,1,2);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffffd48);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
        in_stack_fffffffffffffd6c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd6c);
      } while (bVar1);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd58);
    std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
              ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               in_stack_fffffffffffffd48);
    Minisketch::~Minisketch((Minisketch *)in_stack_fffffffffffffd48);
    Minisketch::~Minisketch((Minisketch *)in_stack_fffffffffffffd48);
    Minisketch::~Minisketch((Minisketch *)in_stack_fffffffffffffd48);
    Minisketch::~Minisketch((Minisketch *)in_stack_fffffffffffffd48);
    Minisketch::~Minisketch((Minisketch *)in_stack_fffffffffffffd48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(minisketch_test)
{
    for (int i = 0; i < 100; ++i) {
        uint32_t errors = 0 + m_rng.randrange(11);
        uint32_t start_a = 1 + m_rng.randrange(1000000000);
        uint32_t a_not_b = m_rng.randrange(errors + 1);
        uint32_t b_not_a = errors - a_not_b;
        uint32_t both = m_rng.randrange(10000);
        uint32_t end_a = start_a + a_not_b + both;
        uint32_t start_b = start_a + a_not_b;
        uint32_t end_b = start_b + both + b_not_a;

        Minisketch sketch_a = MakeMinisketch32(10);
        for (uint32_t a = start_a; a < end_a; ++a) sketch_a.Add(a);
        Minisketch sketch_b = MakeMinisketch32(10);
        for (uint32_t b = start_b; b < end_b; ++b) sketch_b.Add(b);

        Minisketch sketch_ar = MakeMinisketch32(10);
        Minisketch sketch_br = MakeMinisketch32(10);
        sketch_ar.Deserialize(sketch_a.Serialize());
        sketch_br.Deserialize(sketch_b.Serialize());

        Minisketch sketch_c = std::move(sketch_ar);
        sketch_c.Merge(sketch_br);
        auto dec = sketch_c.Decode(errors);
        BOOST_REQUIRE(dec.has_value());
        auto sols = std::move(*dec);
        std::sort(sols.begin(), sols.end());
        for (uint32_t i = 0; i < a_not_b; ++i) BOOST_CHECK_EQUAL(sols[i], start_a + i);
        for (uint32_t i = 0; i < b_not_a; ++i) BOOST_CHECK_EQUAL(sols[i + a_not_b], start_b + both + i);
    }
}